

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3cb2mllr_io.c
# Opt level: O3

int s3cb2mllr_read(char *fn,int32 **out_cb2mllr,uint32 *out_n_cb,uint32 *out_n_mllr)

{
  uint32 uVar1;
  int iVar2;
  int32 *piVar3;
  bool bVar4;
  int iVar5;
  void *ptr;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  iVar5 = s3map_read(fn,out_cb2mllr,out_n_cb,out_n_mllr,4);
  if (iVar5 == 0) {
    uVar1 = *out_n_cb;
    uVar7 = (ulong)(int)uVar1;
    piVar3 = *out_cb2mllr;
    ptr = __ckd_calloc__((long)(int)*out_n_mllr,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                         ,0x50);
    if (0 < (long)uVar7) {
      uVar10 = 0;
      do {
        uVar6 = piVar3[uVar10];
        if ((int)*out_n_mllr <= (int)uVar6) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                  ,0x55,"%s cb2mllr[%d] -> %d which is >= n_mllr_class (%d)\n",fn,uVar10,
                  (ulong)uVar6,(ulong)*out_n_mllr);
          goto LAB_00102b32;
        }
        if (-1 < (int)uVar6) {
          *(undefined4 *)((long)ptr + (ulong)uVar6 * 4) = 1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
      if (0 < (int)uVar1) {
        uVar9 = 0;
        bVar4 = false;
        uVar10 = 0;
LAB_00102aab:
        do {
          uVar11 = uVar10 + 1;
          lVar8 = (long)piVar3[uVar10];
          if (-1 < lVar8) {
            iVar2 = *(int *)((long)ptr + lVar8 * 4);
            if (bVar4) {
              bVar4 = true;
              if (iVar2 == 1) {
                uVar6 = (int)uVar11 - 2;
                lVar8 = 0x62;
                goto LAB_00102b58;
              }
            }
            else {
              if (iVar2 != 0) {
                bVar4 = false;
                uVar10 = uVar11;
                if (uVar11 == uVar7) goto LAB_00102af5;
                goto LAB_00102aab;
              }
              uVar9 = uVar10 & 0xffffffff;
              bVar4 = true;
            }
          }
          uVar10 = uVar11;
        } while (uVar11 != uVar7);
        if (bVar4) {
          uVar6 = uVar1 - 1;
          lVar8 = 0x67;
LAB_00102b58:
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                  ,lVar8,"cb unmapped in region [%u %u]\n",uVar9,(ulong)uVar6);
LAB_00102b32:
          exit(1);
        }
      }
    }
LAB_00102af5:
    ckd_free(ptr);
  }
  return iVar5;
}

Assistant:

int
s3cb2mllr_read(const char *fn,
	       int32 **out_cb2mllr,
	       uint32 *out_n_cb,
	       uint32 *out_n_mllr)
{
    int ret, i, n_d, n_r;
    int *did_map;
    int32 *cb2mllr;
    int in_hole = FALSE;
    int beg_hole = 0;

    ret = s3map_read(fn,
		     (void **)out_cb2mllr,
		     out_n_cb,
		     out_n_mllr,
		     sizeof(int32));

    
    if (ret == S3_SUCCESS) {
	n_d = *out_n_cb;
	n_r = *out_n_mllr;
	cb2mllr = *out_cb2mllr;
	
	did_map = ckd_calloc(n_r, sizeof(int));

	for (i = 0; i < n_d; i++) {
	    if (cb2mllr[i] >= (int32)*out_n_mllr) {
		E_FATAL("%s cb2mllr[%d] -> %d which is >= n_mllr_class (%d)\n",
			fn, i, cb2mllr[i], *out_n_mllr);
	    }
	    else if (cb2mllr[i] >= 0)
		did_map[cb2mllr[i]] = IS_MAPPED;
	}
	
	for (i = 0; i < n_d; i++) {
	    if (cb2mllr[i] < 0) continue; /* skipped */
	    if (!in_hole && (did_map[cb2mllr[i]] == NOT_MAPPED)) {
		beg_hole = i;
		in_hole = TRUE;
	    }
	    if (in_hole && (did_map[cb2mllr[i]] == IS_MAPPED)) {
		E_FATAL("cb unmapped in region [%u %u]\n", beg_hole, i-1);
		in_hole = FALSE;
	    }
	}
	if (in_hole) {
	    E_FATAL("cb unmapped in region [%u %u]\n", beg_hole, i-1);
	}

	ckd_free(did_map);
    }

    return ret;
}